

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::TestEventListeners::SetDefaultXmlGenerator
          (TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener *pTVar1;
  
  pTVar1 = this->default_xml_generator_;
  if (pTVar1 != listener) {
    (&this->default_result_printer_)[this->default_result_printer_ != pTVar1] =
         (TestEventListener *)0x0;
    pTVar1 = internal::TestEventRepeater::Release(this->repeater_,pTVar1);
    if (pTVar1 != (TestEventListener *)0x0) {
      (*pTVar1->_vptr_TestEventListener[1])(pTVar1);
    }
    this->default_xml_generator_ = listener;
    if (listener != (TestEventListener *)0x0) {
      internal::TestEventRepeater::Append(this->repeater_,listener);
      return;
    }
  }
  return;
}

Assistant:

void TestEventListeners::SetDefaultXmlGenerator(TestEventListener* listener) {
  if (default_xml_generator_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_xml_generator_);
    default_xml_generator_ = listener;
    if (listener != nullptr) Append(listener);
  }
}